

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

_Bool golf_script_load(golf_script_t *script,char *path,char *data,int data_len)

{
  uint *value;
  gs_parser_t *parser;
  int *piVar1;
  int *capacity;
  vec_gs_env_t *data_00;
  byte bVar2;
  gs_env_t **ppgVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  gs_token_t *pgVar8;
  ulong uVar9;
  char *pcVar10;
  map_base_t *m;
  gs_stmt_t *stmt;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  gs_token_type gVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  float fVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  int local_9c;
  gs_token_t token;
  
  pcVar19 = _gs_store.scripts.alloc_category;
  iVar6 = vec_expand_((char **)&_gs_store,&_gs_store.scripts.length,&_gs_store.scripts.capacity,8,
                      _gs_store.scripts.alloc_category);
  if (iVar6 == 0) {
    lVar12 = (long)_gs_store.scripts.length;
    _gs_store.scripts.length = _gs_store.scripts.length + 1;
    _gs_store.scripts.data[lVar12] = script;
  }
  snprintf(script->path,0x400,"%s",path);
  parser = &script->parser;
  (script->parser).tokens.length = 0;
  (script->parser).tokens.capacity = 0;
  script->error = (char *)0x0;
  (script->parser).tokens.data = (gs_token_t *)0x0;
  (script->parser).tokens.alloc_category = "script/parser";
  (script->parser).cur_token = 0;
  (script->parser).error = false;
  (script->parser).allocated_memory.data = (void **)0x0;
  (script->parser).allocated_memory.length = 0;
  (script->parser).allocated_memory.capacity = 0;
  (script->parser).allocated_memory.alloc_category = "script/parser";
  piVar1 = &(script->parser).tokens.length;
  capacity = &(script->parser).tokens.capacity;
  iVar6 = 1;
  iVar16 = 0x1e5b1e;
  local_9c = 1;
  iVar21 = 0;
LAB_0013170e:
  pcVar13 = data + iVar21;
  bVar2 = data[iVar21];
  if (bVar2 == 0x2f) {
    if (pcVar13[1] == '/') {
      cVar5 = '/';
      pcVar13 = data + (long)iVar21 + 1;
      while ((cVar5 != '\0' && (cVar5 != '\n'))) {
        iVar21 = iVar21 + 1;
        cVar5 = *pcVar13;
        pcVar13 = pcVar13 + 1;
      }
    }
    else {
LAB_00131769:
      if ((bVar2 != 0x5f) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
        if ((byte)(bVar2 - 0x30) < 10) {
          iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,
                              (script->parser).tokens.alloc_category);
          if (iVar7 == 0) {
            pgVar8 = (parser->tokens).data;
            iVar7 = *piVar1;
            *piVar1 = iVar7 + 1;
            cVar5 = *pcVar13;
            pcVar19 = (char *)(ulong)(cVar5 == '-');
            fVar22 = 0.0;
            fVar20 = 0.0;
            bVar4 = false;
            fVar23 = 10.0;
            do {
              uVar11 = (uint)(byte)pcVar13[(long)pcVar19];
              if ((byte)(pcVar13[(long)pcVar19] - 0x30U) < 10) {
                if (bVar4) {
                  fVar22 = fVar22 + (float)(int)(uVar11 - 0x30) / fVar23;
                  fVar23 = fVar23 * 10.0;
                }
                else {
                  fVar20 = (float)((int)fVar20 * 10 + uVar11 + -0x30);
                }
              }
              else {
                if (uVar11 != 0x2e) goto LAB_00131a0d;
                bVar4 = true;
              }
              pcVar19 = pcVar19 + 1;
            } while( true );
          }
          goto LAB_00131a63;
        }
        uVar11 = bVar2 - 0x22;
        if (uVar11 < 0x3c) {
          if ((0xa0000001e003fc0U >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
            if ((ulong)uVar11 != 0) goto LAB_0013193f;
            iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,
                                (script->parser).tokens.alloc_category);
            if (iVar7 == 0) {
              pgVar8 = (parser->tokens).data + *piVar1;
              *piVar1 = *piVar1 + 1;
              lVar12 = 0x100000000;
              for (uVar9 = 1; (pcVar13[uVar9] != '\0' && (pcVar13[uVar9] != '\"'));
                  uVar9 = uVar9 + 1) {
                lVar12 = lVar12 + 0x100000000;
              }
              pcVar10 = (char *)golf_alloc_tracked(uVar9 & 0xffffffff,"script/parser");
              lVar12 = lVar12 >> 0x20;
              for (lVar14 = 1; lVar14 < lVar12; lVar14 = lVar14 + 1) {
                pcVar10[lVar14 + -1] = pcVar13[lVar14];
              }
              pcVar10[lVar12 + -1] = '\0';
              iVar16 = (int)uVar9 + (uint)(pcVar13[lVar12] == '\"');
              pgVar8->type = GS_TOKEN_STRING;
              pgVar8->line = local_9c;
              pgVar8->col = iVar6;
              (pgVar8->field_3).symbol = pcVar10;
            }
            iVar21 = iVar21 + iVar16;
            iVar6 = iVar6 + iVar16;
            goto LAB_0013170e;
          }
        }
        else {
LAB_0013193f:
          if ((bVar2 != 0x7b) && (bVar2 != 0x7d)) {
            token.type = GS_TOKEN_CHAR;
            token.line = local_9c;
            token.col = iVar6;
            token.field_3.c = bVar2;
            gs_parser_error(parser,0x1e5bc9);
            goto LAB_00131bb6;
          }
        }
        iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,
                            (script->parser).tokens.alloc_category);
        if (iVar7 == 0) {
          pgVar8 = (parser->tokens).data;
          iVar7 = *piVar1;
          *piVar1 = iVar7 + 1;
          cVar5 = *pcVar13;
          pgVar8[iVar7].type = GS_TOKEN_CHAR;
          pgVar8[iVar7].line = local_9c;
          pgVar8[iVar7].col = iVar6;
          pgVar8[iVar7].field_3.c = cVar5;
        }
        iVar6 = iVar6 + 1;
        iVar21 = iVar21 + 1;
        goto LAB_0013170e;
      }
      iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,
                          (script->parser).tokens.alloc_category);
      iVar17 = 0;
      if (iVar7 == 0) {
        pgVar8 = (parser->tokens).data;
        iVar7 = *piVar1;
        *piVar1 = iVar7 + 1;
        lVar12 = -0x100000000;
        uVar9 = 0;
        do {
          do {
            uVar18 = uVar9;
            bVar2 = pcVar13[uVar18];
            uVar9 = uVar18 + 1;
            lVar12 = lVar12 + 0x100000000;
          } while (bVar2 == 0x5f);
        } while (((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a));
        pcVar10 = (char *)golf_alloc_tracked(uVar9 & 0xffffffff,"script/parser");
        iVar17 = (int)uVar18;
        uVar18 = uVar18 & 0xffffffff;
        if (iVar17 < 1) {
          uVar18 = 0;
        }
        for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
          pcVar10[uVar9] = pcVar13[uVar9];
        }
        pcVar10[lVar12 >> 0x20] = '\0';
        pgVar8[iVar7].type = GS_TOKEN_SYMBOL;
        pgVar8[iVar7].line = local_9c;
        pgVar8[iVar7].col = iVar6;
        pgVar8[iVar7].field_3.symbol = pcVar10;
      }
      iVar21 = iVar21 + iVar17;
      iVar6 = iVar6 + iVar17;
    }
    goto LAB_0013170e;
  }
  if (bVar2 != 0) {
    if (bVar2 == 9) {
LAB_00131761:
      iVar6 = iVar6 + 1;
      iVar21 = iVar21 + 1;
    }
    else {
      if (bVar2 != 10) {
        if ((bVar2 != 0x20) && (bVar2 != 0xd)) goto LAB_00131769;
        goto LAB_00131761;
      }
      local_9c = local_9c + 1;
      iVar21 = iVar21 + 1;
      iVar6 = 1;
    }
    goto LAB_0013170e;
  }
  iVar16 = vec_expand_((char **)parser,piVar1,capacity,0x18,(script->parser).tokens.alloc_category);
  if (iVar16 == 0) {
    pgVar8 = (parser->tokens).data;
    iVar16 = *piVar1;
    *piVar1 = iVar16 + 1;
    pgVar8[iVar16].type = GS_TOKEN_EOF;
    pgVar8[iVar16].line = local_9c;
    pgVar8[iVar16].col = iVar6;
  }
LAB_00131bb6:
  if ((script->parser).error == true) {
LAB_00131bbf:
    script->error = (script->parser).error_string;
  }
  else {
    m = (map_base_t *)golf_alloc_tracked(0x38,"script/eval");
    m[1].buckets = (map_node_t **)0x0;
    m[1].nbuckets = 0;
    m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)0x0;
    m[2].nbuckets = 0;
    m[2].nnodes = 0;
    m->buckets = (map_node_t **)0x0;
    m->nbuckets = 0;
    m->nnodes = 0;
    m[3].buckets = (map_node_t **)"script/eval";
    value = &m[1].nbuckets;
    m[1].nbuckets = 3;
    *(undefined1 *)&m[1].nnodes = 0;
    *(undefined4 *)&m[2].buckets = 0x40490fdb;
    map_set_(m,"PI",value,0x18,"script/eval");
    m[1].nbuckets = 1;
    *(undefined1 *)&m[1].nnodes = 0;
    *(undefined1 *)&m[2].buckets = 1;
    map_set_(m,"true",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 1;
    *(undefined1 *)&m[1].nnodes = 0;
    *(undefined1 *)&m[2].buckets = 0;
    map_set_(m,"false",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_print;
    map_set_(m,"print",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_V2;
    map_set_(m,"V2",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_V3;
    map_set_(m,"V3",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec2_bezier4;
    map_set_(m,"vec2_bezier4",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec3_distance;
    map_set_(m,"vec3_distance",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec3_length;
    map_set_(m,"vec3_length",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec3_normalize;
    map_set_(m,"vec3_normalize",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_cos;
    map_set_(m,"cos",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_sin;
    map_set_(m,"sin",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_acos;
    map_set_(m,"acos",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_asin;
    map_set_(m,"asin",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_sqrt;
    map_set_(m,"sqrt",value,0x18,(char *)m[3].buckets);
    data_00 = &(script->eval).env;
    (script->eval).env.data = (gs_env_t **)0x0;
    (script->eval).env.length = 0;
    (script->eval).env.capacity = 0;
    (script->eval).env.alloc_category = "script/eval";
    piVar1 = &(script->eval).env.length;
    iVar6 = vec_expand_((char **)data_00,piVar1,&(script->eval).env.capacity,8,"script/eval");
    if (iVar6 == 0) {
      ppgVar3 = data_00->data;
      iVar6 = *piVar1;
      *piVar1 = iVar6 + 1;
      ppgVar3[iVar6] = (gs_env_t *)m;
    }
    (script->eval).allocated_strings.data = (void **)0x0;
    (script->eval).allocated_strings.length = 0;
    (script->eval).allocated_strings.capacity = 0;
    (script->eval).allocated_strings.alloc_category = "script/eval";
    (script->eval).allocated_lists.data = (void **)0x0;
    (script->eval).allocated_lists.length = 0;
    (script->eval).allocated_lists.capacity = 0;
    (script->eval).allocated_lists.alloc_category = "script/eval";
    do {
      if ((script->parser).tokens.data[(script->parser).cur_token].type == GS_TOKEN_EOF) {
        return true;
      }
      stmt = gs_parse_stmt(parser);
      if ((script->parser).error == true) goto LAB_00131bbf;
      gs_eval_stmt((gs_val_t *)&token,&script->eval,stmt);
    } while (token.type != 10);
    script->error = (char *)CONCAT44(token._12_4_,token.col);
  }
  return true;
LAB_00131a0d:
  if (bVar4) {
    fVar22 = fVar22 + (float)(int)fVar20;
    if (cVar5 == '-') {
      fVar22 = -fVar22;
    }
    gVar15 = GS_TOKEN_FLOAT;
  }
  else {
    fVar22 = (float)-(int)fVar20;
    if (cVar5 != '-') {
      fVar22 = fVar20;
    }
    gVar15 = GS_TOKEN_INT;
  }
  pgVar8 = pgVar8 + iVar7;
  pgVar8->type = gVar15;
  pgVar8->line = local_9c;
  pgVar8->col = iVar6;
  (pgVar8->field_3).float_val = fVar22;
LAB_00131a63:
  iVar21 = iVar21 + (int)pcVar19;
  iVar6 = iVar6 + (int)pcVar19;
  goto LAB_0013170e;
}

Assistant:

bool golf_script_load(golf_script_t *script, const char *path, const char *data, int data_len) {
    GOLF_UNUSED(data_len);

    vec_push(&_gs_store.scripts, script);

    snprintf(script->path, GOLF_FILE_MAX_PATH, "%s", path);
    script->error = NULL;
    vec_init(&script->parser.tokens, "script/parser");
    script->parser.cur_token = 0;
    script->parser.error = false;
    vec_init(&script->parser.allocated_memory, "script/parser");

    gs_tokenize(&script->parser, data);
    if (script->parser.error) {
        script->error = script->parser.error_string;
        return true;
    }
    if (false) {
        gs_debug_print_tokens(&script->parser.tokens);
    }

    gs_env_t *global_env = golf_alloc_tracked(sizeof(gs_env_t), "script/eval");
    map_init(&global_env->val_map, "script/eval");
    map_set(&global_env->val_map, "PI", gs_val_float(MF_PI));
    map_set(&global_env->val_map, "true", gs_val_bool(true));
    map_set(&global_env->val_map, "false", gs_val_bool(false));
    map_set(&global_env->val_map, "print", gs_val_c_fn(gs_c_fn_print));
    map_set(&global_env->val_map, "V2", gs_val_c_fn(gs_c_fn_V2));
    map_set(&global_env->val_map, "V3", gs_val_c_fn(gs_c_fn_V3));
    map_set(&global_env->val_map, "vec2_bezier4", gs_val_c_fn(gs_c_fn_vec2_bezier4));
    map_set(&global_env->val_map, "vec3_distance", gs_val_c_fn(gs_c_fn_vec3_distance));
    map_set(&global_env->val_map, "vec3_length", gs_val_c_fn(gs_c_fn_vec3_length));
    map_set(&global_env->val_map, "vec3_normalize", gs_val_c_fn(gs_c_fn_vec3_normalize));
    map_set(&global_env->val_map, "cos", gs_val_c_fn(gs_c_fn_cos));
    map_set(&global_env->val_map, "sin", gs_val_c_fn(gs_c_fn_sin));
    map_set(&global_env->val_map, "acos", gs_val_c_fn(gs_c_fn_acos));
    map_set(&global_env->val_map, "asin", gs_val_c_fn(gs_c_fn_asin));
    map_set(&global_env->val_map, "sqrt", gs_val_c_fn(gs_c_fn_sqrt));
    //map_set(&global_env->val_map, "terrain_model_add_point", gs_val_c_fn(gs_c_fn_terrain_model_add_point));
    //map_set(&global_env->val_map, "terrain_model_add_face", gs_val_c_fn(gs_c_fn_terrain_model_add_face));

    vec_init(&script->eval.env, "script/eval");
    vec_push(&script->eval.env, global_env);
    vec_init(&script->eval.allocated_strings, "script/eval");
    vec_init(&script->eval.allocated_lists, "script/eval");

    while (!gs_peek_eof(&script->parser)) {
        gs_stmt_t *stmt = gs_parse_stmt(&script->parser);
        if (script->parser.error) {
            script->error = script->parser.error_string;
            return true;
        }

        gs_val_t val = gs_eval_stmt(&script->eval, stmt);
        if (val.type == GS_VAL_ERROR) {
            script->error = val.error_val;
            return true;
        }
        if (false) {
            gs_debug_print_stmt(stmt, 0);
            gs_debug_print_val(val);
            printf("\n");
        }
    }

    return true;
}